

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofiletools.cpp
# Opt level: O2

string * libcellml::sha1(string *__return_storage_ptr__,string *string)

{
  ulong uVar1;
  uint64_t uVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  ostream *poVar6;
  size_t i;
  size_type __n;
  long lVar7;
  uint64_t transforms;
  string buffer;
  array<unsigned_int,_5UL> digest;
  array<unsigned_int,_16UL> block;
  ostringstream result;
  uint auStack_310 [88];
  istringstream is;
  
  digest._M_elems[0] = 0x67452301;
  digest._M_elems[1] = 0xefcdab89;
  digest._M_elems[2] = 0x98badcfe;
  digest._M_elems[3] = 0x10325476;
  digest._M_elems[4] = 0xc3d2e1f0;
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  transforms = 0;
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)string,_S_in);
  while( true ) {
    auStack_310[6] = 0;
    auStack_310[7] = 0;
    auStack_310[8] = 0;
    auStack_310[9] = 0;
    auStack_310[2] = 0;
    auStack_310[3] = 0;
    auStack_310[4] = 0;
    auStack_310[5] = 0;
    auStack_310[0] = 0;
    auStack_310[1] = 0;
    _result = 0;
    std::istream::read((char *)&is,(long)&result);
    std::__cxx11::string::append((char *)&buffer,(ulong)&result);
    sVar3 = buffer._M_string_length;
    uVar2 = transforms;
    if (buffer._M_string_length != 0x40) break;
    block._M_elems[0xc] = 0;
    block._M_elems[0xd] = 0;
    block._M_elems[0xe] = 0;
    block._M_elems[0xf] = 0;
    block._M_elems[8] = 0;
    block._M_elems[9] = 0;
    block._M_elems[10] = 0;
    block._M_elems[0xb] = 0;
    block._M_elems[4] = 0;
    block._M_elems[5] = 0;
    block._M_elems[6] = 0;
    block._M_elems[7] = 0;
    block._M_elems[0] = 0;
    block._M_elems[1] = 0;
    block._M_elems[2] = 0;
    block._M_elems[3] = 0;
    bufferToBlock(&buffer,&block);
    transform(&digest,&block,&transforms);
    buffer._M_string_length = 0;
    *buffer._M_dataplus._M_p = '\0';
  }
  std::__cxx11::string::append((char *)&buffer);
  sVar4 = buffer._M_string_length;
  uVar1 = uVar2 * 0x200 + sVar3 * 8;
  while (buffer._M_string_length < 0x40) {
    std::__cxx11::string::push_back((char)&buffer);
  }
  block._M_elems[0xc] = 0;
  block._M_elems[0xd] = 0;
  block._M_elems[0xe] = 0;
  block._M_elems[0xf] = 0;
  block._M_elems[8] = 0;
  block._M_elems[9] = 0;
  block._M_elems[10] = 0;
  block._M_elems[0xb] = 0;
  block._M_elems[4] = 0;
  block._M_elems[5] = 0;
  block._M_elems[6] = 0;
  block._M_elems[7] = 0;
  block._M_elems[0] = 0;
  block._M_elems[1] = 0;
  block._M_elems[2] = 0;
  block._M_elems[3] = 0;
  bufferToBlock(&buffer,&block);
  if (0x38 < sVar4) {
    transform(&digest,&block,&transforms);
    for (__n = 0; __n != 0xe; __n = __n + 1) {
      pvVar5 = std::array<unsigned_int,_16UL>::at(&block,__n);
      *pvVar5 = 0;
    }
  }
  block._M_elems._56_8_ = uVar1 >> 0x20 | uVar1 << 0x20;
  transform(&digest,&block,&transforms);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
  for (lVar7 = 0; lVar7 != 0x14; lVar7 = lVar7 + 4) {
    *(uint *)((long)auStack_310 + *(long *)(_result + -0x18)) =
         *(uint *)((long)auStack_310 + *(long *)(_result + -0x18)) & 0xffffffb5 | 8;
    poVar6 = std::operator<<(&result,0x30);
    *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 8;
    std::ostream::_M_insert<unsigned_long>((ulong)&result);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::~string((string *)&buffer);
  return __return_storage_ptr__;
}

Assistant:

std::string sha1(const std::string &string)
{
    std::array<uint32_t, 5> digest = {0x67452301, 0xefcdab89, 0x98badcfe, 0x10325476, 0xc3d2e1f0};
    std::string buffer;
    uint64_t transforms = 0;
    std::istringstream is(string);

    while (true) {
        std::array<char, BLOCK_BYTES> sbuf = {};

        is.read(sbuf.data(), int64_t(BLOCK_BYTES - buffer.size()));

        buffer.append(sbuf.data(), size_t(is.gcount()));

        if (buffer.size() != BLOCK_BYTES) {
            break;
        }

        std::array<uint32_t, BLOCK_INTS> block = {};

        bufferToBlock(buffer, block);
        transform(digest, block, transforms);

        buffer.clear();
    }

    uint64_t totalBits = (transforms * BLOCK_BYTES + buffer.size()) * 8;

    buffer += "\x80";

    size_t origSize = buffer.size();

    while (buffer.size() < BLOCK_BYTES) {
        buffer += char(0x00);
    }

    std::array<uint32_t, BLOCK_INTS> block = {};

    bufferToBlock(buffer, block);

    if (origSize > BLOCK_BYTES - 8) {
        transform(digest, block, transforms);

        for (size_t i = 0; i < BLOCK_INTS - 2; ++i) {
            block.at(i) = 0;
        }
    }

    block[BLOCK_INTS - 1] = uint32_t(totalBits);
    block[BLOCK_INTS - 2] = uint32_t(totalBits >> 32U);

    transform(digest, block, transforms);

    std::ostringstream result;

    for (uint32_t d : digest) {
        result << std::hex << std::setfill('0') << std::setw(8);
        result << d;
    }

    return result.str();
}